

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFHighLevelEncoder.cpp
# Opt level: O1

void ZXing::Pdf417::EncodeNumeric
               (wstring *msg,int startpos,int count,vector<int,_std::allocator<int>_> *output)

{
  int iVar1;
  int iVar2;
  wstring *pwVar3;
  undefined4 in_register_00000034;
  int iVar4;
  vector<int,_std::allocator<int>_> tmp;
  BigInteger bigint;
  BigInteger num900;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> part;
  BigInteger r;
  vector<int,_std::allocator<int>_> local_f8;
  int local_dc;
  BigInteger local_d8;
  BigInteger local_b8;
  int *local_98;
  vector<int,std::allocator<int>> *local_90;
  wstring *local_88;
  undefined8 local_80;
  wstring local_78;
  int *local_58;
  BigInteger local_50;
  
  local_80 = CONCAT44(in_register_00000034,startpos);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_90 = (vector<int,std::allocator<int>> *)output;
  local_88 = msg;
  std::vector<int,_std::allocator<int>_>::reserve(&local_f8,(long)(count / 3 + 1));
  local_b8.negative = false;
  local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start + 1;
  *local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 900;
  local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (0 < count) {
    iVar4 = 0;
    local_dc = count;
    do {
      if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      iVar1 = local_dc - iVar4;
      if (0x2b < local_dc - iVar4) {
        iVar1 = 0x2c;
      }
      std::__cxx11::wstring::substr((ulong)&local_d8,(ulong)local_88);
      pwVar3 = (wstring *)std::__cxx11::wstring::replace((ulong)&local_d8,0,(wchar_t *)0x0,0x1a004c)
      ;
      std::__cxx11::wstring::wstring((wstring *)&local_78,pwVar3);
      if ((pointer *)CONCAT71(local_d8._1_7_,local_d8.negative) !=
          &local_d8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((undefined1 *)CONCAT71(local_d8._1_7_,local_d8.negative),
                        (long)local_d8.mag.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish * 4 + 4);
      }
      local_d8.negative = false;
      local_d8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.negative = false;
      local_50.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      BigInteger::TryParse(&local_78,&local_d8);
      do {
        BigInteger::Divide(&local_d8,&local_b8,&local_d8,&local_50);
        iVar2 = BigInteger::toInt(&local_50);
        local_98 = (int *)CONCAT44(local_98._4_4_,iVar2);
        if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_f8,
                     (iterator)
                     local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_98);
        }
        else {
          *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar2;
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      } while (local_d8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start !=
               local_d8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      local_98 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_58 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      std::vector<int,std::allocator<int>>::
      _M_range_insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                (local_90,*(undefined8 *)(local_90 + 8),&local_98,&local_58);
      if (local_50.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.mag.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.mag.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.mag.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.mag.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.mag.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.mag.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
      }
      iVar4 = iVar1 + iVar4;
    } while (iVar4 < local_dc);
  }
  if (local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.mag.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.mag.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void EncodeNumeric(const std::wstring& msg, int startpos, int count, std::vector<int>& output)
{
	int idx = 0;
	std::vector<int> tmp;
	tmp.reserve(count / 3 + 1);
	BigInteger num900(900);
	while (idx < count) {
		tmp.clear();
		int len = std::min(44, count - idx);
		auto part = L"1" + msg.substr(startpos + idx, len);

		BigInteger bigint, r;
		BigInteger::TryParse(part, bigint);
		do {
			BigInteger::Divide(bigint, num900, bigint, r);
			tmp.push_back(r.toInt());
		} while (!bigint.isZero());

		//Reverse temporary string
		output.insert(output.end(), tmp.rbegin(), tmp.rend());
		idx += len;
	}
}